

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O1

int __thiscall QWidgetItem::heightForWidth(QWidgetItem *this,int w)

{
  long lVar1;
  QWidget *this_00;
  bool bVar2;
  int iVar3;
  Representation RVar4;
  QLayout *pQVar5;
  QSize QVar6;
  
  iVar3 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[8])();
  if ((char)iVar3 == '\0') {
    bVar2 = QWidget::testAttribute_helper(this->wid,WA_LayoutUsesWidgetRect);
    if (!bVar2) {
      lVar1 = *(long *)&this->wid->field_0x8;
      w = (w - *(char *)(lVar1 + 0x1a0)) - (int)*(char *)(lVar1 + 0x1a2);
    }
    pQVar5 = QWidget::layout(this->wid);
    this_00 = this->wid;
    if (pQVar5 == (QLayout *)0x0) {
      RVar4.m_i = (**(code **)(*(long *)this_00 + 0x80))(this_00,w);
    }
    else {
      pQVar5 = QWidget::layout(this_00);
      RVar4.m_i = QLayout::totalHeightForWidth(pQVar5,w);
    }
    QVar6 = QWidget::maximumSize(this->wid);
    if (QVar6.ht.m_i.m_i < RVar4.m_i) {
      QVar6 = QWidget::maximumSize(this->wid);
      RVar4 = QVar6.ht.m_i;
    }
    QVar6 = QWidget::minimumSize(this->wid);
    if (RVar4.m_i < QVar6.ht.m_i.m_i) {
      QVar6 = QWidget::minimumSize(this->wid);
      RVar4 = QVar6.ht.m_i;
    }
    bVar2 = QWidget::testAttribute_helper(this->wid,WA_LayoutUsesWidgetRect);
    if (!bVar2) {
      lVar1 = *(long *)&this->wid->field_0x8;
      RVar4.m_i = RVar4.m_i + *(char *)(lVar1 + 0x1a1) + (int)*(char *)(lVar1 + 0x1a3);
    }
    iVar3 = 0;
    if (0 < RVar4.m_i) {
      iVar3 = RVar4.m_i;
    }
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int QWidgetItem::heightForWidth(int w) const
{
    if (isEmpty())
        return -1;

    w = !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
      ? fromLayoutItemSize(wid->d_func(), QSize(w, 0)).width()
      : w;

    int hfw;
    if (wid->layout())
        hfw = wid->layout()->totalHeightForWidth(w);
    else
        hfw = wid->heightForWidth(w);

    if (hfw > wid->maximumHeight())
        hfw = wid->maximumHeight();
    if (hfw < wid->minimumHeight())
        hfw = wid->minimumHeight();

    hfw = !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
        ? toLayoutItemSize(wid->d_func(), QSize(0, hfw)).height()
        : hfw;

    if (hfw < 0)
        hfw = 0;
    return hfw;
}